

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void * fio_malloc(size_t size)

{
  fio_lock_i fVar1;
  ushort uVar2;
  void *pvVar3;
  arena_s *paVar4;
  block_s *blk;
  int *piVar5;
  arena_s *paVar6;
  ulong uVar7;
  block_s *pbVar8;
  ulong uVar9;
  long lVar10;
  ushort uVar11;
  long lVar12;
  undefined8 *puVar13;
  long in_FS_OFFSET;
  bool bVar14;
  fio_lock_i ret;
  timespec local_28;
  
  if (size == 0) {
    return &on_malloc_zero;
  }
  if (0x3fff < size) {
    pvVar3 = big_alloc(size);
    return pvVar3;
  }
  lVar12 = ((size >> 4) + 1) - (ulong)((size & 0xf) == 0);
  paVar4 = *(arena_s **)(in_FS_OFFSET + -0x2b0);
  if (*(arena_s **)(in_FS_OFFSET + -0x2b0) == (arena_s *)0x0) {
    paVar4 = arenas;
  }
  LOCK();
  fVar1 = paVar4->lock;
  paVar4->lock = '\x01';
  UNLOCK();
  local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fVar1);
  paVar6 = arenas;
  uVar7 = memory.cores;
  if (fVar1 != '\0') {
    do {
      uVar9 = (long)paVar4 - (long)paVar6 >> 4;
      if (uVar9 < uVar7) {
        lVar10 = 0;
        do {
          if (paVar4 == paVar6 || lVar10 != 0) {
            LOCK();
            fVar1 = (&paVar4->lock)[lVar10];
            (&paVar4->lock)[lVar10] = '\x01';
            UNLOCK();
            local_28.tv_sec = CONCAT71(local_28.tv_sec._1_7_,fVar1);
            paVar6 = arenas;
            uVar7 = memory.cores;
            if (fVar1 == '\0') {
              paVar4 = (arena_s *)((long)&paVar4->block + lVar10);
              goto LAB_0012e566;
            }
          }
          uVar9 = uVar9 + 1;
          lVar10 = lVar10 + 0x10;
        } while (uVar9 < uVar7);
      }
      bVar14 = paVar4 == paVar6;
      paVar4 = paVar6;
      if (bVar14) {
        local_28.tv_sec = 0;
        local_28.tv_nsec = 1;
        nanosleep(&local_28,(timespec *)0x0);
        paVar4 = arenas;
        paVar6 = arenas;
        uVar7 = memory.cores;
      }
    } while( true );
  }
LAB_0012e566:
  *(arena_s **)(in_FS_OFFSET + -0x2b0) = paVar4;
  blk = paVar4->block;
  if (blk == (block_s *)0x0) {
LAB_0012e590:
    blk = block_new();
    puVar13 = *(undefined8 **)(in_FS_OFFSET + -0x2b0);
    *puVar13 = blk;
    if (blk == (block_s *)0x0) {
      piVar5 = __errno_location();
      *piVar5 = 0xc;
      pbVar8 = (block_s *)0x0;
      goto LAB_0012e5fd;
    }
    uVar2 = blk->pos;
  }
  else {
    uVar2 = blk->pos;
    if (0x7fe < lVar12 + (ulong)uVar2) {
      block_free(blk);
      goto LAB_0012e590;
    }
  }
  LOCK();
  blk->ref = blk->ref + 1;
  UNLOCK();
  uVar11 = (short)lVar12 + blk->pos;
  pbVar8 = blk + uVar2;
  blk->pos = uVar11;
  if (uVar11 < 0x7fe) {
    puVar13 = *(undefined8 **)(in_FS_OFFSET + -0x2b0);
  }
  else {
    block_free(blk);
    puVar13 = *(undefined8 **)(in_FS_OFFSET + -0x2b0);
    *puVar13 = 0;
  }
LAB_0012e5fd:
  LOCK();
  *(undefined1 *)(puVar13 + 1) = 0;
  UNLOCK();
  return pbVar8;
}

Assistant:

void *fio_malloc(size_t size) {
#if FIO_OVERRIDE_MALLOC
  if (!arenas)
    fio_mem_init();
#endif
  if (!size) {
    /* changed behavior prevents "allocation failed" test for `malloc(0)` */
    return (void *)(&on_malloc_zero);
  }
  if (size >= FIO_MEMORY_BLOCK_ALLOC_LIMIT) {
    /* system allocation - must be block aligned */
    // FIO_LOG_WARNING("fio_malloc re-routed to mmap - big allocation");
    return big_alloc(size);
  }
  /* ceiling for 16 byte alignement, translated to 16 byte units */
  size = (size >> 4) + (!!(size & 15));
  arena_enter();
  void *mem = block_slice(size);
  arena_exit();
  return mem;
}